

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O0

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::~CircularArray(CircularArray<wabt::Token,_2UL> *this)

{
  CircularArray<wabt::Token,_2UL> *this_local;
  
  clear(this);
  std::array<wabt::Token,_2UL>::~array(&this->contents_);
  return;
}

Assistant:

~CircularArray() { clear(); }